

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O2

string * __thiscall
Downloader_libcurl::getFileNameFromURL
          (string *__return_storage_ptr__,Downloader_libcurl *this,string *downloadURL)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  uVar3 = (uint)downloadURL->_M_string_length;
  while (uVar3 = uVar3 - 1, -1 < (int)uVar3) {
    if ((downloadURL->_M_dataplus)._M_p[uVar3 & 0x7fffffff] == '/') {
      std::__cxx11::string::string((string *)&local_50,"",&local_51);
      bVar2 = std::operator!=(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) break;
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Downloader_libcurl::getFileNameFromURL(const std::string &downloadURL)
{
    std::string result = std::string("");
    for (int i = downloadURL.length() - 1; i >= 0; i--)
    {
        if (downloadURL[i] == '/' && result != std::string("")) break;
        result += downloadURL[i];
    }
    std::reverse(result.begin(), result.end());
    return result;
}